

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

string * __thiscall
cmLocalGenerator::GetObjectFileNameWithoutTarget
          (string *__return_storage_ptr__,cmLocalGenerator *this,cmSourceFile *source,
          string *dir_max,bool *hasSourceExtension,char *customOutputExtension)

{
  cmStateSnapshot *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  cmLocalGenerator *this_01;
  bool bVar3;
  string *psVar4;
  string *psVar5;
  long lVar6;
  byte bVar7;
  bool bVar8;
  string lang;
  string objectName;
  string repVar;
  string relFromBinary;
  string relFromSource;
  string local_108;
  cmSourceFile *local_e8;
  undefined1 local_e0 [16];
  undefined1 local_d0 [32];
  string local_b0;
  string local_90;
  bool *local_70;
  string *local_68;
  string *local_60;
  cmLocalGenerator *local_58;
  string local_50;
  
  local_e8 = source;
  local_d0._24_8_ = customOutputExtension;
  local_70 = hasSourceExtension;
  local_68 = dir_max;
  local_60 = __return_storage_ptr__;
  psVar4 = cmSourceFile::GetFullPath_abi_cxx11_(source);
  this_00 = &this->StateSnapshot;
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_e0,this_00);
  psVar5 = cmStateDirectory::GetCurrentSource_abi_cxx11_((cmStateDirectory *)local_e0);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_e0,this_00);
  cmStateDirectory::ConvertToRelPathIfNotContained
            (&local_50,(cmStateDirectory *)local_e0,psVar5,psVar4);
  if (local_50._M_string_length == 0) {
    __assert_fail("!relFromSource.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmLocalGenerator.cxx"
                  ,0xa1e,
                  "std::string cmLocalGenerator::GetObjectFileNameWithoutTarget(const cmSourceFile &, const std::string &, bool *, const char *)"
                 );
  }
  cmsys::SystemTools::FileIsFullPath(&local_50);
  local_58 = this;
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_e0,this_00);
  psVar5 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)local_e0);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_e0,this_00);
  cmStateDirectory::ConvertToRelPathIfNotContained
            (&local_90,(cmStateDirectory *)local_e0,psVar5,psVar4);
  if (local_90._M_string_length != 0) {
    cmsys::SystemTools::FileIsFullPath(&local_90);
    local_e0._8_8_ = 0;
    local_d0[0] = '\0';
    local_e0._0_8_ = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_d0;
    std::__cxx11::string::_M_assign((string *)local_e0);
    this_01 = local_58;
    bVar3 = cmsys::SystemTools::FileIsFullPath((string *)local_e0);
    if ((bVar3) &&
       (bVar3 = cmake::GetIsInTryCompile(this_01->GlobalGenerator->CMakeInstance), bVar3)) {
      psVar4 = cmSourceFile::GetFullPath_abi_cxx11_(local_e8);
      cmsys::SystemTools::GetFilenameName(&local_108,psVar4);
      std::__cxx11::string::operator=((string *)local_e0,(string *)&local_108);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
    }
    paVar1 = &local_108.field_2;
    local_108._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"KEEP_EXTENSION","");
    bVar3 = cmSourceFile::GetPropertyAsBool(local_e8,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != paVar1) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    bVar8 = true;
    if (!bVar3) {
      bVar3 = NeedBackwardsCompatibility_2_4(this_01);
      if (!bVar3) {
        cmSourceFile::GetLanguage_abi_cxx11_(&local_108,local_e8);
        if (local_108._M_string_length != 0) {
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)(local_d0 + 0x20),"CMAKE_","");
          std::__cxx11::string::_M_append(local_d0 + 0x20,(ulong)local_108._M_dataplus._M_p);
          std::__cxx11::string::append(local_d0 + 0x20);
          bVar3 = cmMakefile::IsOn(this_01->Makefile,(string *)(local_d0 + 0x20));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != paVar1) {
          operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
        }
      }
      bVar7 = (pointer)local_d0._24_8_ != (pointer)0x0 | bVar3;
      if ((bVar7 == 1) && (lVar6 = std::__cxx11::string::rfind((char)local_e0,0x2e), lVar6 != -1)) {
        std::__cxx11::string::substr((ulong)&local_108,(ulong)local_e0);
        std::__cxx11::string::operator=((string *)local_e0,(string *)&local_108);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != paVar1) {
          operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
        }
      }
      if ((pointer)local_d0._24_8_ == (pointer)0x0) {
        cmGlobalGenerator::GetLanguageOutputExtension_abi_cxx11_
                  (&local_108,this_01->GlobalGenerator,local_e8);
        std::__cxx11::string::_M_append(local_e0,(ulong)local_108._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != paVar1) {
          operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        std::__cxx11::string::append(local_e0);
      }
      bVar8 = (bool)(bVar7 ^ 1);
    }
    if (local_70 != (bool *)0x0) {
      *local_70 = bVar8;
    }
    psVar5 = CreateSafeUniqueObjectFileName(this_01,(string *)local_e0,local_68);
    psVar4 = local_60;
    (local_60->_M_dataplus)._M_p = (pointer)&local_60->field_2;
    pcVar2 = (psVar5->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_60,pcVar2,pcVar2 + psVar5->_M_string_length);
    if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_e0._0_8_ !=
        (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_d0) {
      operator_delete((void *)local_e0._0_8_,CONCAT71(local_d0._1_7_,local_d0[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    return psVar4;
  }
  __assert_fail("!relFromBinary.empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmLocalGenerator.cxx"
                ,0xa25,
                "std::string cmLocalGenerator::GetObjectFileNameWithoutTarget(const cmSourceFile &, const std::string &, bool *, const char *)"
               );
}

Assistant:

std::string cmLocalGenerator::GetObjectFileNameWithoutTarget(
  const cmSourceFile& source, std::string const& dir_max,
  bool* hasSourceExtension, char const* customOutputExtension)
{
  // Construct the object file name using the full path to the source
  // file which is its only unique identification.
  std::string const& fullPath = source.GetFullPath();

  // Try referencing the source relative to the source tree.
  std::string relFromSource = this->MaybeConvertToRelativePath(
    this->GetCurrentSourceDirectory(), fullPath);
  assert(!relFromSource.empty());
  bool relSource = !cmSystemTools::FileIsFullPath(relFromSource);
  bool subSource = relSource && relFromSource[0] != '.';

  // Try referencing the source relative to the binary tree.
  std::string relFromBinary = this->MaybeConvertToRelativePath(
    this->GetCurrentBinaryDirectory(), fullPath);
  assert(!relFromBinary.empty());
  bool relBinary = !cmSystemTools::FileIsFullPath(relFromBinary);
  bool subBinary = relBinary && relFromBinary[0] != '.';

  // Select a nice-looking reference to the source file to construct
  // the object file name.
  std::string objectName;
  if ((relSource && !relBinary) || (subSource && !subBinary)) {
    objectName = relFromSource;
  } else if ((relBinary && !relSource) || (subBinary && !subSource)) {
    objectName = relFromBinary;
  } else if (relFromBinary.length() < relFromSource.length()) {
    objectName = relFromBinary;
  } else {
    objectName = relFromSource;
  }

  // if it is still a full path check for the try compile case
  // try compile never have in source sources, and should not
  // have conflicting source file names in the same target
  if (cmSystemTools::FileIsFullPath(objectName)) {
    if (this->GetGlobalGenerator()->GetCMakeInstance()->GetIsInTryCompile()) {
      objectName = cmSystemTools::GetFilenameName(source.GetFullPath());
    }
  }

  // Replace the original source file extension with the object file
  // extension.
  bool keptSourceExtension = true;
  if (!source.GetPropertyAsBool("KEEP_EXTENSION")) {
    // Decide whether this language wants to replace the source
    // extension with the object extension.  For CMake 2.4
    // compatibility do this by default.
    bool replaceExt = this->NeedBackwardsCompatibility_2_4();
    if (!replaceExt) {
      std::string lang = source.GetLanguage();
      if (!lang.empty()) {
        std::string repVar = "CMAKE_";
        repVar += lang;
        repVar += "_OUTPUT_EXTENSION_REPLACE";
        replaceExt = this->Makefile->IsOn(repVar);
      }
    }

    // Remove the source extension if it is to be replaced.
    if (replaceExt || customOutputExtension) {
      keptSourceExtension = false;
      std::string::size_type dot_pos = objectName.rfind('.');
      if (dot_pos != std::string::npos) {
        objectName = objectName.substr(0, dot_pos);
      }
    }

    // Store the new extension.
    if (customOutputExtension) {
      objectName += customOutputExtension;
    } else {
      objectName += this->GlobalGenerator->GetLanguageOutputExtension(source);
    }
  }
  if (hasSourceExtension) {
    *hasSourceExtension = keptSourceExtension;
  }

  // Convert to a safe name.
  return this->CreateSafeUniqueObjectFileName(objectName, dir_max);
}